

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimerinfo_unix.cpp
# Opt level: O3

optional<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> __thiscall
QTimerInfoList::timerWait(QTimerInfoList *this)

{
  QTimerInfo **ppQVar1;
  ulong uVar2;
  long lVar3;
  undefined4 uVar4;
  QTimerInfo **ppQVar5;
  QTimerInfo **ppQVar6;
  ulong uVar7;
  long lVar8;
  optional<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> oVar9;
  
  lVar3 = std::chrono::_V2::steady_clock::now();
  (this->currentTime).__d.__r = lVar3;
  ppQVar5 = (this->timers).d.ptr;
  uVar7 = (this->timers).d.size;
  ppQVar1 = ppQVar5 + uVar7;
  if (0 < (long)uVar7 >> 2) {
    uVar2 = uVar7 * 8;
    lVar8 = ((long)uVar7 >> 2) + 1;
    ppQVar6 = ppQVar5 + 2;
    do {
      if (ppQVar6[-2]->activateRef == (QTimerInfo **)0x0) {
        ppQVar6 = ppQVar6 + -2;
        goto LAB_003bf339;
      }
      if (ppQVar6[-1]->activateRef == (QTimerInfo **)0x0) {
        ppQVar6 = ppQVar6 + -1;
        goto LAB_003bf339;
      }
      if ((*ppQVar6)->activateRef == (QTimerInfo **)0x0) goto LAB_003bf339;
      if (ppQVar6[1]->activateRef == (QTimerInfo **)0x0) {
        ppQVar6 = ppQVar6 + 1;
        goto LAB_003bf339;
      }
      lVar8 = lVar8 + -1;
      ppQVar6 = ppQVar6 + 4;
    } while (1 < lVar8);
    uVar7 = (ulong)((uint)uVar7 & 3);
    ppQVar5 = (QTimerInfo **)((uVar2 & 0xffffffffffffffe0) + (long)ppQVar5);
  }
  if (uVar7 == 1) {
LAB_003bf318:
    ppQVar6 = ppQVar5;
    if ((*ppQVar5)->activateRef != (QTimerInfo **)0x0) {
      ppQVar6 = ppQVar1;
    }
LAB_003bf339:
    if (ppQVar6 != ppQVar1) {
      lVar8 = ((*ppQVar6)->timeout).__d.__r;
      uVar4 = (undefined4)CONCAT71((int7)((ulong)*ppQVar6 >> 8),1);
      uVar7 = lVar8 - lVar3;
      if (uVar7 == 0 || lVar8 < lVar3) {
        lVar3 = 0;
      }
      else {
        lVar3 = (uVar7 / 1000000 + (ulong)((uVar7 / 1000000) * 1000000 < uVar7)) * 1000000;
      }
      goto LAB_003bf37c;
    }
  }
  else {
    if (uVar7 == 2) {
LAB_003bf30a:
      ppQVar6 = ppQVar5;
      if ((*ppQVar5)->activateRef != (QTimerInfo **)0x0) {
        ppQVar5 = ppQVar5 + 1;
        goto LAB_003bf318;
      }
      goto LAB_003bf339;
    }
    if (uVar7 == 3) {
      ppQVar6 = ppQVar5;
      if ((*ppQVar5)->activateRef != (QTimerInfo **)0x0) {
        ppQVar5 = ppQVar5 + 1;
        goto LAB_003bf30a;
      }
      goto LAB_003bf339;
    }
  }
  uVar4 = 0;
LAB_003bf37c:
  oVar9.super__Optional_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true,_true>.
  _M_payload.
  super__Optional_payload_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>._8_4_ =
       uVar4;
  oVar9.super__Optional_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true,_true>.
  _M_payload.
  super__Optional_payload_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
  _M_payload = (_Storage<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true>)lVar3;
  oVar9.super__Optional_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true,_true>.
  _M_payload.
  super__Optional_payload_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>._12_4_ =
       0;
  return (optional<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
         oVar9.
         super__Optional_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true,_true>
         ._M_payload.
         super__Optional_payload_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>;
}

Assistant:

std::optional<QTimerInfoList::Duration> QTimerInfoList::timerWait()
{
    steady_clock::time_point now = updateCurrentTime();

    auto isWaiting = [](QTimerInfo *tinfo) { return !tinfo->activateRef; };
    // Find first waiting timer not already active
    auto it = std::find_if(timers.cbegin(), timers.cend(), isWaiting);
    if (it == timers.cend())
        return std::nullopt;

    Duration timeToWait = (*it)->timeout - now;
    if (timeToWait > 0ns)
        return roundToMillisecond(timeToWait);
    return 0ms;
}